

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Types.hpp
# Opt level: O3

bool __thiscall QAM::operator<(QAM *this,QAM *rhs)

{
  int iVar1;
  int iVar2;
  byte extraout_var;
  long lVar3;
  bool bVar4;
  undefined1 auVar5 [16];
  
  lVar3 = 0;
  do {
    iVar1 = *(int *)((long)(this->qam)._M_elems + lVar3);
    iVar2 = *(int *)((long)(rhs->qam)._M_elems + lVar3);
    if (iVar1 < iVar2) {
      return true;
    }
  } while ((iVar1 <= iVar2) && (bVar4 = lVar3 != 0xc, lVar3 = lVar3 + 4, bVar4));
  auVar5[0] = -((char)(rhs->qam)._M_elems[0] == (char)(this->qam)._M_elems[0]);
  auVar5[1] = -(*(char *)((long)(rhs->qam)._M_elems + 1) ==
               *(char *)((long)(this->qam)._M_elems + 1));
  auVar5[2] = -(*(char *)((long)(rhs->qam)._M_elems + 2) ==
               *(char *)((long)(this->qam)._M_elems + 2));
  auVar5[3] = -(*(char *)((long)(rhs->qam)._M_elems + 3) ==
               *(char *)((long)(this->qam)._M_elems + 3));
  auVar5[4] = -((char)(rhs->qam)._M_elems[1] == (char)(this->qam)._M_elems[1]);
  auVar5[5] = -(*(char *)((long)(rhs->qam)._M_elems + 5) ==
               *(char *)((long)(this->qam)._M_elems + 5));
  auVar5[6] = -(*(char *)((long)(rhs->qam)._M_elems + 6) ==
               *(char *)((long)(this->qam)._M_elems + 6));
  auVar5[7] = -(*(char *)((long)(rhs->qam)._M_elems + 7) ==
               *(char *)((long)(this->qam)._M_elems + 7));
  auVar5[8] = -((char)(rhs->qam)._M_elems[2] == (char)(this->qam)._M_elems[2]);
  auVar5[9] = -(*(char *)((long)(rhs->qam)._M_elems + 9) ==
               *(char *)((long)(this->qam)._M_elems + 9));
  auVar5[10] = -(*(char *)((long)(rhs->qam)._M_elems + 10) ==
                *(char *)((long)(this->qam)._M_elems + 10));
  auVar5[0xb] = -(*(char *)((long)(rhs->qam)._M_elems + 0xb) ==
                 *(char *)((long)(this->qam)._M_elems + 0xb));
  auVar5[0xc] = -((char)(rhs->qam)._M_elems[3] == (char)(this->qam)._M_elems[3]);
  auVar5[0xd] = -(*(char *)((long)(rhs->qam)._M_elems + 0xd) ==
                 *(char *)((long)(this->qam)._M_elems + 0xd));
  auVar5[0xe] = -(*(char *)((long)(rhs->qam)._M_elems + 0xe) ==
                 *(char *)((long)(this->qam)._M_elems + 0xe));
  auVar5[0xf] = -(*(char *)((long)(rhs->qam)._M_elems + 0xf) ==
                 *(char *)((long)(this->qam)._M_elems + 0xf));
  if ((ushort)((ushort)(SUB161(auVar5 >> 7,0) & 1) | (ushort)(SUB161(auVar5 >> 0xf,0) & 1) << 1 |
               (ushort)(SUB161(auVar5 >> 0x17,0) & 1) << 2 |
               (ushort)(SUB161(auVar5 >> 0x1f,0) & 1) << 3 |
               (ushort)(SUB161(auVar5 >> 0x27,0) & 1) << 4 |
               (ushort)(SUB161(auVar5 >> 0x2f,0) & 1) << 5 |
               (ushort)(SUB161(auVar5 >> 0x37,0) & 1) << 6 |
               (ushort)(SUB161(auVar5 >> 0x3f,0) & 1) << 7 |
               (ushort)(SUB161(auVar5 >> 0x47,0) & 1) << 8 |
               (ushort)(SUB161(auVar5 >> 0x4f,0) & 1) << 9 |
               (ushort)(SUB161(auVar5 >> 0x57,0) & 1) << 10 |
               (ushort)(SUB161(auVar5 >> 0x5f,0) & 1) << 0xb |
               (ushort)(SUB161(auVar5 >> 0x67,0) & 1) << 0xc |
               (ushort)(SUB161(auVar5 >> 0x6f,0) & 1) << 0xd |
               (ushort)(SUB161(auVar5 >> 0x77,0) & 1) << 0xe | (ushort)(auVar5[0xf] >> 7) << 0xf) ==
      0xffff) {
    std::__cxx11::string::compare((string *)&this->tag);
    bVar4 = (bool)(extraout_var >> 7);
  }
  else {
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

bool operator<(const QAM & rhs) const
    {
        if(qam < rhs.qam)
            return true;
        else if(qam == rhs.qam)
            return tag < rhs.tag;
        else
            return false;
    }